

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O3

string * __thiscall
vkt::DynamicState::ShaderSourceProvider::getSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderSourceProvider *this,Archive *archive,char *path)

{
  pointer puVar1;
  int iVar2;
  undefined4 uVar3;
  long *plVar4;
  size_t sVar5;
  pointer puVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readBuffer;
  allocator_type local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  plVar4 = (long *)(**(code **)(*(long *)this + 0x10))(this,archive);
  iVar2 = (**(code **)(*plVar4 + 0x18))(plVar4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_30,(long)(iVar2 + 1),&local_31);
  puVar1 = local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (**(code **)(*plVar4 + 0x18))(plVar4);
  (**(code **)(*plVar4 + 0x10))(plVar4,puVar1,uVar3);
  puVar1 = local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish[-1] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    puVar6 = &DAT_00000001;
  }
  else {
    sVar5 = strlen((char *)local_30.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
    puVar6 = puVar1 + sVar5;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,puVar1,puVar6);
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (**(code **)(*plVar4 + 8))(plVar4);
  return __return_storage_ptr__;
}

Assistant:

static std::string getSource(tcu::Archive& archive, const char* path)
	{
		de::UniquePtr<tcu::Resource> resource(archive.getResource(path));

		std::vector<deUint8> readBuffer(resource->getSize() + 1);
		resource->read(&readBuffer[0], resource->getSize());
		readBuffer[readBuffer.size() - 1] = 0;

		return std::string(reinterpret_cast<const char*>(&readBuffer[0]));
	}